

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state_54.cpp
# Opt level: O3

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine_lua54
          (vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,lua_State *L)

{
  pointer *ppplVar1;
  iterator __position;
  lua_State *plVar2;
  lua_State *local_20;
  
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar2 = (lua_State *)L->l_G->allgc;
  if (plVar2 != (lua_State *)0x0) {
    do {
      if (plVar2->tt == '\b') {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_20 = plVar2;
          std::vector<lua_State*,std::allocator<lua_State*>>::_M_realloc_insert<lua_State*>
                    ((vector<lua_State*,std::allocator<lua_State*>> *)__return_storage_ptr__,
                     __position,&local_20);
        }
        else {
          *__position._M_current = plVar2;
          ppplVar1 = &(__return_storage_ptr__->
                      super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *ppplVar1 = *ppplVar1 + 1;
        }
      }
      plVar2 = (lua_State *)plVar2->next;
    } while (plVar2 != (lua_State *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine_lua54(lua_State* L)
{
	std::vector<lua_State*> result;
	auto head = G(L)->allgc;

	while (head)
	{
		if (head->tt == LUA_TTHREAD)
		{
			result.push_back(reinterpret_cast<lua_State*>(head));
		}
		head = head->next;
	}

	return result;
}